

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O3

sc_string_old __thiscall sc_dt::sc_string_old::lowercase(sc_string_old *this)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  sc_string_rep *psVar4;
  sc_string_old *in_RSI;
  
  sVar2 = strlen(in_RSI->rep->str);
  sc_string_old(this,in_RSI);
  if (0 < (int)(uint)sVar2) {
    psVar4 = this->rep;
    uVar3 = 0;
    do {
      bVar1 = psVar4->str[uVar3];
      if ((byte)(bVar1 + 0xbf) < 0x1a) {
        psVar4->str[uVar3] = bVar1 | 0x20;
        psVar4 = this->rep;
      }
      uVar3 = uVar3 + 1;
    } while (((uint)sVar2 & 0x7fffffff) != uVar3);
  }
  return (sc_string_old)(sc_string_rep *)this;
}

Assistant:

sc_string_old
sc_string_old::lowercase()const
{
    int len = length();
    sc_string_old temp(*this);
    for(int i=0; i<len; i++)
    {
	char c = temp.rep->str[i];
	if(c>='A' && c<='Z')
	    temp.rep->str[i] = static_cast<char>( c+32 );
    }
    return temp;
}